

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void alloc_context_buffers_ext(AV1_COMMON *cm,MBMIExtFrameBufferInfo *mbmi_ext_info)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long *in_RSI;
  long in_RDI;
  int new_ext_mi_size;
  int mi_alloc_cols;
  int mi_alloc_rows;
  int mi_alloc_size_1d;
  CommonModeInfoParams *mi_params;
  
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [*(byte *)(in_RDI + 0x230)];
  iVar2 = (int)(*(int *)(in_RDI + 0x218) + uVar1 + -1) / (int)uVar1;
  iVar3 = ((int)(*(int *)(in_RDI + 0x214) + uVar1 + -1) / (int)uVar1) * iVar2;
  if ((int)in_RSI[1] < iVar3) {
    dealloc_context_buffers_ext((MBMIExtFrameBufferInfo *)0xaa6a2b);
    pvVar4 = aom_malloc(0xaa6a38);
    *in_RSI = (long)pvVar4;
    if (*in_RSI == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mbmi_ext_info->frame_base");
    }
    *(int *)(in_RSI + 1) = iVar3;
  }
  *(int *)((long)in_RSI + 0xc) = iVar2;
  return;
}

Assistant:

static inline void alloc_context_buffers_ext(
    AV1_COMMON *cm, MBMIExtFrameBufferInfo *mbmi_ext_info) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  const int mi_alloc_size_1d = mi_size_wide[mi_params->mi_alloc_bsize];
  const int mi_alloc_rows =
      (mi_params->mi_rows + mi_alloc_size_1d - 1) / mi_alloc_size_1d;
  const int mi_alloc_cols =
      (mi_params->mi_cols + mi_alloc_size_1d - 1) / mi_alloc_size_1d;
  const int new_ext_mi_size = mi_alloc_rows * mi_alloc_cols;

  if (new_ext_mi_size > mbmi_ext_info->alloc_size) {
    dealloc_context_buffers_ext(mbmi_ext_info);
    CHECK_MEM_ERROR(
        cm, mbmi_ext_info->frame_base,
        aom_malloc(new_ext_mi_size * sizeof(*mbmi_ext_info->frame_base)));
    mbmi_ext_info->alloc_size = new_ext_mi_size;
  }
  // The stride needs to be updated regardless of whether new allocation
  // happened or not.
  mbmi_ext_info->stride = mi_alloc_cols;
}